

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checkseg4split(tetgenmesh *this,face *chkseg,point *encpt,int *qflag)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  point pdVar6;
  point p2;
  double dStack_b0;
  int t1ver;
  double smdist;
  double diff;
  double d;
  point eapex;
  triface spintet;
  triface searchtet;
  point fdest;
  point forg;
  int i;
  double r;
  double len;
  double ccent [3];
  int *qflag_local;
  point *encpt_local;
  face *chkseg_local;
  tetgenmesh *this_local;
  
  ccent[2] = (double)qflag;
  pdVar6 = sorg(this,chkseg);
  p2 = sdest(this,chkseg);
  *encpt = (point)0x0;
  *(undefined4 *)ccent[2] = 0;
  dVar2 = distance(this,pdVar6,p2);
  dVar3 = dVar2 * 0.5;
  for (forg._4_4_ = 0; forg._4_4_ < 3; forg._4_4_ = forg._4_4_ + 1) {
    ccent[(long)forg._4_4_ + -1] = (pdVar6[forg._4_4_] + p2[forg._4_4_]) * 0.5;
  }
  if (((this->checkconstraints == 0) || (dVar4 = areabound(this,chkseg), dVar4 <= 0.0)) ||
     (dVar4 = areabound(this,chkseg), dVar2 <= dVar4)) {
    if ((this->b->fixedvolume == 0) ||
       (dVar2 = dVar2 * dVar2 * dVar2, pdVar1 = &this->b->maxvolume,
       dVar2 < *pdVar1 || dVar2 == *pdVar1)) {
      if ((this->b->metric == 0) ||
         (((pdVar6[this->pointmtrindex] <= 0.0 ||
           (dVar3 < pdVar6[this->pointmtrindex] || dVar3 == pdVar6[this->pointmtrindex])) &&
          ((p2[this->pointmtrindex] <= 0.0 ||
           (dVar3 < p2[this->pointmtrindex] || dVar3 == p2[this->pointmtrindex])))))) {
        triface::triface((triface *)&spintet.ver);
        triface::triface((triface *)&eapex);
        dStack_b0 = 0.0;
        sstpivot1(this,chkseg,(triface *)&spintet.ver);
        triface::operator=((triface *)&eapex,(triface *)&spintet.ver);
        do {
          pdVar6 = apex(this,(triface *)&eapex);
          if (pdVar6 != this->dummypoint) {
            dVar2 = distance(this,&len,pdVar6);
            smdist = dVar2 - dVar3;
            if (ABS(smdist) / dVar3 < this->b->epsilon) {
              smdist = 0.0;
            }
            if (smdist < 0.0) {
              if (this->useinsertradius == 0) {
                *encpt = pdVar6;
                break;
              }
              if (*encpt == (point)0x0) {
                *encpt = pdVar6;
                dStack_b0 = dVar2;
              }
              else if (dVar2 < dStack_b0) {
                *encpt = pdVar6;
                dStack_b0 = dVar2;
              }
            }
          }
          iVar5 = (int)spintet.tet;
          decode(this,(tetrahedron)eapex[facepivot1[(int)spintet.tet]],(triface *)&eapex);
          spintet.tet._0_4_ = facepivot2[iVar5][(int)spintet.tet];
        } while (eapex != (point)spintet._8_8_);
        if (*encpt == (point)0x0) {
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        *(undefined4 *)ccent[2] = 1;
        this_local._4_4_ = 1;
      }
    }
    else {
      *(undefined4 *)ccent[2] = 1;
      this_local._4_4_ = 1;
    }
  }
  else {
    *(undefined4 *)ccent[2] = 1;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::checkseg4split(face *chkseg, point& encpt, int& qflag)
{
  REAL ccent[3], len, r;
  int i;

  point forg = sorg(*chkseg);
  point fdest = sdest(*chkseg);

  // Initialize the return values.
  encpt = NULL;
  qflag = 0;

  len = distance(forg, fdest);
  r = 0.5 * len;
  for (i = 0; i < 3; i++) {
    ccent[i] = 0.5 * (forg[i] + fdest[i]);
  }

  // First check its quality.
  if (checkconstraints && (areabound(*chkseg) > 0.0)) {
    if (len > areabound(*chkseg)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((len * len * len) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((forg[pointmtrindex] > 0) && (r > forg[pointmtrindex])) ||
        ((fdest[pointmtrindex]) > 0 && (r > fdest[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }


  // Second check if it is encroached.
  // Comment: There may exist more than one encroaching points of this segment. 
  //   The 'encpt' returns the one which is closet to it.
  triface searchtet, spintet;
  point eapex;
  REAL d, diff, smdist = 0;
  int t1ver;

  sstpivot1(*chkseg, searchtet);
  spintet = searchtet;
  while (1) {
    eapex = apex(spintet);
    if (eapex != dummypoint) {
      d = distance(ccent, eapex);
      diff = d - r;
      if (fabs(diff) / r < b->epsilon) diff = 0.0; // Rounding.
      if (diff < 0) {
        // This segment is encroached by eapex.
        if (useinsertradius) {
          if (encpt == NULL) {
            encpt = eapex;
            smdist = d;
          } else {
            // Choose the closet encroaching point.
            if (d < smdist) {
              encpt = eapex;
              smdist = d;
            }
          }
        } else {
          encpt = eapex;
          break;
        }
      }
    }
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  } // while (1)

  if (encpt != NULL) {
    return 1;
  }

  return 0; // No need to split it.
}